

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall
Clone_componentWithImportAndChildren_Test::TestBody(Clone_componentWithImportAndChildren_Test *this)

{
  string *psVar1;
  ComponentPtr cClone;
  ComponentPtr c;
  ComponentPtr c2;
  ComponentPtr c1;
  ImportSourcePtr import;
  long *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78 [2];
  string *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::ImportSource::create();
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"some-other-model.xml","");
  libcellml::ImportSource::setUrl(local_38);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  psVar1 = local_68;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unique","");
  libcellml::Entity::setId(psVar1);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  psVar1 = local_68;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"copy","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"child_1","");
  libcellml::NamedEntity::setName(local_48);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"child_2","");
  libcellml::NamedEntity::setName(local_58);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_68);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_68);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"my_component_name","");
  libcellml::Component::setSourceComponent((shared_ptr *)local_68,(string *)&local_38);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  libcellml::Component::clone();
  local_28 = 0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  compareComponent((shared_ptr *)&local_68,(shared_ptr *)&local_88,(shared_ptr *)&local_28);
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return;
}

Assistant:

TEST(Clone, componentWithImportAndChildren)
{
    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();
    auto import = libcellml::ImportSource::create();

    import->setUrl("some-other-model.xml");
    c->setId("unique");
    c->setName("copy");
    c1->setName("child_1");
    c2->setName("child_2");

    c->addComponent(c1);
    c->addComponent(c2);
    c->setSourceComponent(import, "my_component_name");

    auto cClone = c->clone();

    compareComponent(c, cClone);
}